

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O1

deFile * deFile_createFromHandle(deUintptr handle)

{
  deFile *pdVar1;
  
  pdVar1 = (deFile *)deCalloc(4);
  if (pdVar1 == (deFile *)0x0) {
    close((int)handle);
  }
  else {
    pdVar1->fd = (int)handle;
  }
  return pdVar1;
}

Assistant:

deFile* deFile_createFromHandle (deUintptr handle)
{
	int		fd		= (int)handle;
	deFile* file	= (deFile*)deCalloc(sizeof(deFile));
	if (!file)
	{
		close(fd);
		return file;
	}

	file->fd = fd;
	return file;
}